

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

int p2t::cmp(void *param_1,void *param_2)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined8 in_RAX;
  
  dVar1 = *(double *)((long)param_1 + 8);
  dVar2 = *(double *)((long)param_2 + 8);
  iVar3 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if ((dVar2 <= dVar1) &&
     (((dVar1 != dVar2 || (NAN(dVar1) || NAN(dVar2))) ||
      (*param_2 < *param_1 || *param_2 == *param_1)))) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

inline bool cmp(const Point* a, const Point* b)
{
  if (a->y < b->y) {
    return true;
  } else if (a->y == b->y) {
    // Make sure q is point with greater x value
    if (a->x < b->x) {
      return true;
    }
  }
  return false;
}